

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::NetParameter::NetParameter(NetParameter *this,NetParameter *from)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  NetState *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__NetParameter_0075f7a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::RepeatedPtrField
            (&this->layers_,&from->layers_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->input_,&from->input_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->input_dim_,&from->input_dim_);
  google::protobuf::RepeatedPtrField<caffe::BlobShape>::RepeatedPtrField
            (&this->input_shape_,&from->input_shape_);
  google::protobuf::RepeatedPtrField<caffe::LayerParameter>::RepeatedPtrField
            (&this->layer_,&from->layer_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (from->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar3 & 2) == 0) {
    this_00 = (NetState *)0x0;
  }
  else {
    this_00 = (NetState *)operator_new(0x38);
    NetState::NetState(this_00,from->state_);
  }
  this->state_ = this_00;
  bVar2 = from->debug_info_;
  this->force_backward_ = from->force_backward_;
  this->debug_info_ = bVar2;
  return;
}

Assistant:

NetParameter::NetParameter(const NetParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      layers_(from.layers_),
      input_(from.input_),
      input_dim_(from.input_dim_),
      input_shape_(from.input_shape_),
      layer_(from.layer_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_state()) {
    state_ = new ::caffe::NetState(*from.state_);
  } else {
    state_ = NULL;
  }
  ::memcpy(&force_backward_, &from.force_backward_,
    reinterpret_cast<char*>(&debug_info_) -
    reinterpret_cast<char*>(&force_backward_) + sizeof(debug_info_));
  // @@protoc_insertion_point(copy_constructor:caffe.NetParameter)
}